

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

int connecting_getsock(Curl_easy *data,curl_socket_t *socks)

{
  curl_socket_t cVar1;
  int iVar2;
  
  if (data->conn == (connectdata *)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    cVar1 = Curl_conn_get_socket(data,0);
    if (cVar1 != -1) {
      *socks = cVar1;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

static int connecting_getsock(struct Curl_easy *data, curl_socket_t *socks)
{
  struct connectdata *conn = data->conn;
  curl_socket_t sockfd;

  if(!conn)
    return GETSOCK_BLANK;
  sockfd = Curl_conn_get_socket(data, FIRSTSOCKET);
  if(sockfd != CURL_SOCKET_BAD) {
    /* Default is to wait to something from the server */
    socks[0] = sockfd;
    return GETSOCK_READSOCK(0);
  }
  return GETSOCK_BLANK;
}